

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_slider_int(nk_context *ctx,int min,int *val,int max,int step)

{
  int iVar1;
  float local_30 [2];
  float value;
  int ret;
  int step_local;
  int max_local;
  int *val_local;
  nk_context *pnStack_10;
  int min_local;
  nk_context *ctx_local;
  
  local_30[0] = (float)*val;
  value = (float)step;
  ret = max;
  _step_local = val;
  val_local._4_4_ = min;
  pnStack_10 = ctx;
  iVar1 = nk_slider_float(ctx,(float)min,local_30,(float)max,(float)step);
  *_step_local = (int)local_30[0];
  return iVar1;
}

Assistant:

NK_API int
nk_slider_int(struct nk_context *ctx, int min, int *val, int max, int step)
{
    int ret;
    float value = (float)*val;
    ret = nk_slider_float(ctx, (float)min, &value, (float)max, (float)step);
    *val =  (int)value;
    return ret;
}